

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::UniqueName(string *name,string *filename,Options *options)

{
  string *in_RDI;
  string *in_stack_00000018;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_40 [64];
  
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  FilenameIdentifier(in_stack_00000018);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

string UniqueName(const std::string& name, const std::string& filename,
                  const Options& options) {
  return name + "_" + FilenameIdentifier(filename);
}